

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * __thiscall
doctest::detail::
stringifyBinaryExpr<boost::iterator_range<boost::iterators::indirect_iterator<__gnu_cxx::__normal_iterator<std::_List_const_iterator<int>const*,std::vector<std::_List_const_iterator<int>,std::allocator<std::_List_const_iterator<int>>>>,boost::use_default,boost::use_default,boost::use_default,boost::use_default>>,std::vector<int,std::allocator<int>>>
          (String *__return_storage_ptr__,detail *this,
          iterator_range<boost::iterators::indirect_iterator<__gnu_cxx::__normal_iterator<const_std::_List_const_iterator<int>_*,_std::vector<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>_>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>_>
          *lhs,char *op,vector<int,_std::allocator<int>_> *rhs)

{
  String local_98;
  String local_70;
  String local_58;
  String local_40;
  vector<int,_std::allocator<int>_> *local_28;
  vector<int,_std::allocator<int>_> *rhs_local;
  char *op_local;
  iterator_range<boost::iterators::indirect_iterator<__gnu_cxx::__normal_iterator<const_std::_List_const_iterator<int>_*,_std::vector<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>_>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>_>
  *lhs_local;
  
  local_28 = (vector<int,_std::allocator<int>_> *)op;
  rhs_local = (vector<int,_std::allocator<int>_> *)lhs;
  op_local = (char *)this;
  lhs_local = (iterator_range<boost::iterators::indirect_iterator<__gnu_cxx::__normal_iterator<const_std::_List_const_iterator<int>_*,_std::vector<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>_>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>_>
               *)__return_storage_ptr__;
  toString<boost::iterator_range<boost::iterators::indirect_iterator<__gnu_cxx::__normal_iterator<const_std::_List_const_iterator<int>_*,_std::vector<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>_>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>_>,_true>
            (&local_58,
             (iterator_range<boost::iterators::indirect_iterator<__gnu_cxx::__normal_iterator<const_std::_List_const_iterator<int>_*,_std::vector<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>_>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>_>
              *)this);
  String::String(&local_70,(char *)rhs_local);
  doctest::operator+(&local_40,&local_58,&local_70);
  toString<std::vector<int,_std::allocator<int>_>,_true>(&local_98,local_28);
  doctest::operator+(__return_storage_ptr__,&local_40,&local_98);
  String::~String(&local_98);
  String::~String(&local_40);
  String::~String(&local_70);
  String::~String(&local_58);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }